

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setop_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::SetOpRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SetOpRelation *this,idx_t depth)

{
  Relation *pRVar1;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Relation::RenderWhitespace_abi_cxx11_(&str,(Relation *)depth,depth);
  if ((byte)(this->setop_type - UNION) < 3) {
    ::std::__cxx11::string::append((char *)&str);
    ::std::operator+(&local_a0,&str,anon_var_dwarf_3b2a754 + 8);
    pRVar1 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
    (*pRVar1->_vptr_Relation[6])(&local_40,pRVar1,depth + 1);
    ::std::operator+(&local_c0,&local_a0,&local_40);
    pRVar1 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
    (*pRVar1->_vptr_Relation[6])(&local_60,pRVar1,depth + 1);
    ::std::operator+(__return_storage_ptr__,&local_c0,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&str);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_c0,"Unknown setop type",(allocator *)&local_a0);
  InternalException::InternalException(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string SetOpRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth);
	switch (setop_type) {
	case SetOperationType::UNION:
		str += "Union";
		break;
	case SetOperationType::EXCEPT:
		str += "Except";
		break;
	case SetOperationType::INTERSECT:
		str += "Intersect";
		break;
	default:
		throw InternalException("Unknown setop type");
	}
	return str + "\n" + left->ToString(depth + 1) + right->ToString(depth + 1);
}